

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O0

void __thiscall Unary::Unary(Unary *this,shared_ptr<Token> *t,shared_ptr<Expr> *x)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_a1;
  string local_a0;
  shared_ptr<Type> local_80;
  shared_ptr<Type> local_70;
  undefined1 local_60 [64];
  shared_ptr<Expr> *local_20;
  shared_ptr<Expr> *x_local;
  shared_ptr<Token> *t_local;
  Unary *this_local;
  
  local_20 = x;
  x_local = (shared_ptr<Expr> *)t;
  t_local = (shared_ptr<Token> *)this;
  std::shared_ptr<Token>::shared_ptr((shared_ptr<Token> *)(local_60 + 0x30),t);
  std::shared_ptr<Type>::shared_ptr((shared_ptr<Type> *)(local_60 + 0x20),(nullptr_t)0x0);
  Op::Op(&this->super_Op,(shared_ptr<Token> *)(local_60 + 0x30),
         (shared_ptr<Type> *)(local_60 + 0x20));
  std::shared_ptr<Type>::~shared_ptr((shared_ptr<Type> *)(local_60 + 0x20));
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)(local_60 + 0x30));
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR_toJson_abi_cxx11__0016efe0;
  std::shared_ptr<Expr>::shared_ptr(&this->expr,x);
  std::shared_ptr<Type>::shared_ptr(&local_70,&Type::Int);
  peVar2 = std::__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)x);
  std::shared_ptr<Type>::shared_ptr(&local_80,&peVar2->type);
  Type::max((Type *)local_60,&local_70,&local_80);
  std::shared_ptr<Type>::operator=(&(this->super_Op).super_Expr.type,(shared_ptr<Type> *)local_60);
  std::shared_ptr<Type>::~shared_ptr((shared_ptr<Type> *)local_60);
  std::shared_ptr<Type>::~shared_ptr(&local_80);
  std::shared_ptr<Type>::~shared_ptr(&local_70);
  bVar1 = std::operator==(&(this->super_Op).super_Expr.type,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"type error",&local_a1);
    Node::error((Node *)this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  return;
}

Assistant:

Unary(std::shared_ptr<Token> t, std::shared_ptr<Expr> x) : Op(t, nullptr), expr(x) {
		type = Type::max(Type::Int, x->type);
		if (type == nullptr) error("type error");
	}